

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O2

pool_ptr<soul::Module> __thiscall
soul::Program::ProgramImpl::findModuleContainingFunction(ProgramImpl *this,Function *f)

{
  long *plVar1;
  bool bVar2;
  Function *in_RDX;
  long *plVar3;
  long lVar4;
  
  plVar3 = (long *)(f->parameters).numActive;
  plVar1 = (long *)(f->parameters).numAllocated;
  lVar4 = 0;
  do {
    if (plVar3 == plVar1) {
LAB_001f7f33:
      *(long *)this = lVar4;
      return (pool_ptr<soul::Module>)(Module *)this;
    }
    bVar2 = contains<soul::ArrayWithPreallocation<soul::pool_ref<soul::heart::Function>,32ul>,soul::heart::Function_const&>
                      ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Function>,_32UL> *)
                       (*plVar3 + 0x130),in_RDX);
    if (bVar2) {
      lVar4 = *plVar3;
      goto LAB_001f7f33;
    }
    plVar3 = plVar3 + 1;
  } while( true );
}

Assistant:

pool_ptr<Module> findModuleContainingFunction (const heart::Function& f) const
    {
        for (auto& m : modules)
            if (m->functions.contains (f))
                return m;

        return {};
    }